

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O2

void deqp::gles31::Functional::anon_unknown_0::generateBufferVariableMatrixVariableCases
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup,
               ProgramResourcePropFlags targetProp)

{
  ArrayElement *this;
  Variable *this_00;
  ResourceTestCase *this_01;
  SharedPtr variable;
  ProgramResourceQueryTestTarget local_58;
  SharedPtr unsized;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&unsized,glcts::fixed_sample_locations_values + 1,
             (allocator<char> *)&variable);
  generateBufferBackedVariableAggregateTypeCases
            (context,parentStructure,targetGroup,PROGRAMINTERFACE_BUFFER_VARIABLE,targetProp,
             TYPE_FLOAT_MAT3X2,(string *)&unsized,2);
  std::__cxx11::string::~string((string *)&unsized);
  this = (ArrayElement *)operator_new(0x28);
  ResourceDefinition::ArrayElement::ArrayElement(this,parentStructure,-2);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&unsized,(Node *)this);
  this_00 = (Variable *)operator_new(0x28);
  ResourceDefinition::Variable::Variable(this_00,&unsized,TYPE_FLOAT_MAT3X2);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&variable,(Node *)this_00);
  this_01 = (ResourceTestCase *)operator_new(0xb0);
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
            (&local_58,PROGRAMINTERFACE_BUFFER_VARIABLE,targetProp);
  ResourceTestCase::ResourceTestCase(this_01,context,&variable,&local_58,"var_unsized_array");
  tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)this_01);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&variable);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&unsized);
  return;
}

Assistant:

static void generateBufferVariableMatrixVariableCases (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* targetGroup, ProgramResourcePropFlags targetProp)
{
	// Basic aggregates
	generateBufferBackedVariableAggregateTypeCases(context, parentStructure, targetGroup, PROGRAMINTERFACE_BUFFER_VARIABLE, targetProp, glu::TYPE_FLOAT_MAT3X2, "", 2);

	// Unsized array
	{
		const ResourceDefinition::Node::SharedPtr	unsized		(new ResourceDefinition::ArrayElement(parentStructure, ResourceDefinition::ArrayElement::UNSIZED_ARRAY));
		const ResourceDefinition::Node::SharedPtr	variable	(new ResourceDefinition::Variable(unsized, glu::TYPE_FLOAT_MAT3X2));

		targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_BUFFER_VARIABLE, targetProp), "var_unsized_array"));
	}
}